

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O0

void __thiscall OB::Parg::Parg(Parg *this,int _argc,char **_argv)

{
  char **_argv_local;
  int _argc_local;
  Parg *this_local;
  
  this->argc_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->argv_);
  std::__cxx11::string::string((string *)&this->name_);
  std::__cxx11::string::string((string *)&this->version_);
  std::__cxx11::string::string((string *)&this->usage_);
  std::__cxx11::string::string((string *)&this->description_);
  std::__cxx11::string::string((string *)&this->modes_);
  std::__cxx11::string::string((string *)&this->options_);
  this->options_indent_ = 0;
  std::vector<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>::vector(&this->info_);
  std::__cxx11::string::string((string *)&this->author_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
  ::map(&this->data_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->flags_);
  this->is_positional_ = false;
  std::__cxx11::string::string((string *)&this->positional_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->positional_vec_);
  std::__cxx11::string::string((string *)&this->stdin_);
  this->is_stdin_ = false;
  this->status_ = 0;
  std::__cxx11::string::string((string *)&this->error_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->similar_);
  this->argc_ = _argc;
  argvf(this,_argv);
  return;
}

Assistant:

Parg(int _argc, char** _argv)
  {
    argc_ = _argc;
    argvf(_argv);
  }